

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O2

quaternion operator!(quaternion *in_quat1)

{
  quaternion qVar1;
  
  qVar1._0_8_ = *(ulong *)in_quat1 ^ 0x8000000000000000;
  qVar1.field_1._4_8_ = *(ulong *)((long)&in_quat1->field_1 + 4) ^ 0x8000000080000000;
  return qVar1;
}

Assistant:

quaternion operator!(const quaternion &in_quat1) {
    quaternion temp = {0.f};

    temp.w = in_quat1.w;
    temp.q1 = -in_quat1.q1;
    temp.q2 = -in_quat1.q2;
    temp.q3 = -in_quat1.q3;

    return temp;
}